

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.c
# Opt level: O3

axbStatus_t axbVecPointwiseMult(axbVec_s *w,axbVec_s *x,axbVec_s *y)

{
  if (x->init == 0x1d232) {
    if (y->init == 0x1d232) {
      if (w->init == 0x1d232) {
        (*w->opBackend->op_table[0x15].func)();
        return 0;
      }
      axbVecPointwiseMult_cold_3();
    }
    else {
      axbVecPointwiseMult_cold_2();
    }
  }
  else {
    axbVecPointwiseMult_cold_1();
  }
  return 0x1d232;
}

Assistant:

axbStatus_t axbVecPointwiseMult(struct axbVec_s *w, const struct axbVec_s *x, const struct axbVec_s *y)
{
  AXB_VECTOR_INIT_CHECK(x);
  AXB_VECTOR_INIT_CHECK(y);
  AXB_VECTOR_INIT_CHECK(w);

  axbOpDescriptor_t op_desc = w->opBackend->op_table[AXB_OP_VEC_POINTWISEMULT];
  axbStatus_t (*op)(struct axbVec_s *, const struct axbVec_s *, const struct axbVec_s *, void*) = (axbStatus_t (*)(struct axbVec_s *, const struct axbVec_s *, const struct axbVec_s *, void*)) op_desc.func;
  op(w, x, y, op_desc.func_data);
  return 0;
}